

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_example_cpp_64(bool copy_on_write)

{
  undefined1 auVar1 [16];
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  Roaring64Map *this;
  uint64_t a_00;
  fd_set *__writefds;
  size_t __n;
  char *__format;
  byte in_DIL;
  fd_set *__exceptfds;
  timeval *__timeout;
  Roaring64Map b_1;
  Roaring64Map a_1;
  Roaring64Map a;
  Roaring64Map b;
  const_iterator i_2;
  uint64_t counter;
  Roaring64Map t;
  char *serializedbytes;
  size_t expectedsize;
  Roaring64Map i1_2;
  Roaring64Map bigunion;
  Roaring64Map *allmybitmaps [3];
  Roaring64Map r1_2_3;
  Roaring64Map z;
  Roaring64Map r1f;
  uint64_t *arr1;
  uint64_t card1;
  Roaring64Map r3;
  uint32_t values [3];
  uint64_t element;
  Roaring64Map r2id;
  Roaring64Map r2i;
  Roaring64Map r2;
  uint64_t compact_size;
  uint64_t size;
  uint64_t cardinality;
  uint64_t i_1;
  uint64_t i;
  Roaring64Map r1;
  undefined8 in_stack_fffffffffffff9c8;
  int iVar5;
  Roaring64Map *r;
  Roaring64Map *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  undefined1 *b_00;
  Roaring64Map *in_stack_fffffffffffff9e0;
  Roaring64Map *in_stack_fffffffffffff9e8;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_fffffffffffff9f0;
  Roaring64Map *in_stack_fffffffffffff9f8;
  Roaring64Map *in_stack_fffffffffffffa00;
  size_type in_stack_fffffffffffffa08;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_fffffffffffffa10;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_fffffffffffffa18;
  Roaring64Map *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  undefined1 local_4c8 [72];
  Roaring64Map **in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb88;
  undefined1 local_370 [56];
  void *local_338;
  size_t local_330;
  Roaring64Map *local_2b8;
  Roaring64Map *local_2b0;
  undefined1 *local_2a8;
  void *local_1f8;
  uint64_t local_1f0;
  undefined1 local_1e8 [56];
  undefined8 local_1b0;
  undefined4 local_1a8;
  fd_set local_1a0;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  __fd_mask *local_f8;
  undefined8 local_f0;
  Roaring64Map local_b0;
  size_t local_78;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  Roaring64Map local_40;
  byte local_1;
  
  local_1 = in_DIL & 1;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0);
  roaring::Roaring64Map::setCopyOnWrite
            ((Roaring64Map *)in_stack_fffffffffffff9f0,
             SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  for (local_58 = 100; local_58 < 1000; local_58 = local_58 + 1) {
    roaring::Roaring64Map::add(in_stack_fffffffffffff9e0,(uint64_t)in_stack_fffffffffffff9d8);
  }
  for (local_60 = 0xc249fdd327780064; iVar5 = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
      local_60 < 0xc249fdd3277803e8; local_60 = local_60 + 1) {
    roaring::Roaring64Map::add(in_stack_fffffffffffff9e0,(uint64_t)in_stack_fffffffffffff9d8);
  }
  roaring::Roaring64Map::contains(in_stack_fffffffffffff9f8,(uint64_t)in_stack_fffffffffffff9f0);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,iVar5);
  local_68 = roaring::Roaring64Map::cardinality(in_stack_fffffffffffffa00);
  poVar3 = std::operator<<((ostream *)&std::cout,"Cardinality = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_70 = roaring::Roaring64Map::getSizeInBytes
                       ((Roaring64Map *)in_stack_fffffffffffff9f0,
                        SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  roaring::Roaring64Map::runOptimize(in_stack_fffffffffffff9e0);
  local_78 = roaring::Roaring64Map::getSizeInBytes
                       ((Roaring64Map *)in_stack_fffffffffffff9f0,
                        SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"size before run optimize ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_70);
  poVar3 = std::operator<<(poVar3," bytes, and after ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_78);
  poVar3 = std::operator<<(poVar3," bytes.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  r = (Roaring64Map *)0xc249fdd327780064;
  __format = (char *)0x5;
  __exceptfds = (fd_set *)0x368d117c00;
  __timeout = (timeval *)0x2d98f13692;
  roaring::Roaring64Map::bitmapOf((size_t)&local_b0,5,1,2);
  roaring::Roaring64Map::printf(&local_b0,__format);
  printf("\n");
  local_118 = 0x368d117c00;
  uStack_110 = 0x2d98f13692;
  local_1a0.fds_bits[0xf] = 1;
  uStack_120 = 2;
  local_108 = 0xc249fdd327780064;
  local_f8 = local_1a0.fds_bits + 0xf;
  local_f0 = 5;
  l_00._M_len = in_stack_fffffffffffffa08;
  l_00._M_array = (iterator)in_stack_fffffffffffffa00;
  roaring::Roaring64Map::bitmapOfList(l_00);
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  local_1a0.fds_bits[3] = 0x368d117c00;
  local_1a0.fds_bits[4] = 0x2d98f13692;
  local_1a0.fds_bits[1] = 1;
  local_1a0.fds_bits[2] = 2;
  local_1a0.fds_bits[5] = -0x3db6022cd887ff9c;
  local_1a0.fds_bits[6] = (__fd_mask)(local_1a0.fds_bits + 1);
  local_1a0.fds_bits[7] = 5;
  l._M_len = (size_type)in_stack_fffffffffffffa00;
  l._M_array = (iterator)in_stack_fffffffffffff9f8;
  roaring::Roaring64Map::Roaring64Map((Roaring64Map *)in_stack_fffffffffffff9f0,l);
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  __writefds = (fd_set *)0x23a;
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::select(&local_b0,4,&local_1a0,__writefds,__exceptfds,__timeout);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::minimum(in_stack_fffffffffffff9e8);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::maximum(in_stack_fffffffffffff9e8);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::rank((Roaring64Map *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  local_1b0 = 0x300000002;
  local_1a8 = 4;
  roaring::Roaring64Map::Roaring64Map
            ((Roaring64Map *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
             (uint32_t *)in_stack_fffffffffffff9e0);
  roaring::Roaring64Map::setCopyOnWrite
            ((Roaring64Map *)in_stack_fffffffffffff9f0,
             SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  local_1f0 = roaring::Roaring64Map::cardinality(in_stack_fffffffffffffa00);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1f0;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_1f8 = operator_new__(uVar4);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::toUint64Array
            ((Roaring64Map *)in_stack_fffffffffffff9f0,(uint64_t *)in_stack_fffffffffffff9e8);
  roaring::Roaring64Map::Roaring64Map
            ((Roaring64Map *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
             (uint64_t *)in_stack_fffffffffffff9e0);
  if (local_1f8 != (void *)0x0) {
    operator_delete__(local_1f8);
  }
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0,r);
  roaring::Roaring64Map::setCopyOnWrite
            ((Roaring64Map *)in_stack_fffffffffffff9f0,
             SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::operator|
            ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             in_stack_fffffffffffffa30);
  roaring::Roaring64Map::setCopyOnWrite
            ((Roaring64Map *)in_stack_fffffffffffff9f0,
             SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  roaring::Roaring64Map::operator|=
            ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             in_stack_fffffffffffffa30);
  local_2b8 = &local_40;
  local_2b0 = &local_b0;
  local_2a8 = local_1e8;
  roaring::Roaring64Map::fastunion(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  __n = 0x264;
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::operator&
            ((Roaring64Map *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
             in_stack_fffffffffffffa30);
  local_330 = roaring::Roaring64Map::getSizeInBytes
                        ((Roaring64Map *)in_stack_fffffffffffff9f0,
                         SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  local_338 = operator_new__(local_330);
  roaring::Roaring64Map::write(&local_40,(int)local_338,(void *)0x1,__n);
  roaring::Roaring64Map::read((int)local_370,local_338,1);
  roaring::Roaring64Map::getSizeInBytes
            ((Roaring64Map *)in_stack_fffffffffffff9f0,
             SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0));
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::operator==
            ((Roaring64Map *)in_stack_fffffffffffffa18,(Roaring64Map *)in_stack_fffffffffffffa10);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  if (local_338 != (void *)0x0) {
    operator_delete__(local_338);
  }
  roaring::Roaring64Map::iterate
            (in_stack_fffffffffffffa00,(roaring_iterator64)in_stack_fffffffffffff9f8,
             in_stack_fffffffffffff9f0);
  roaring::Roaring64Map::begin(in_stack_fffffffffffff9d0);
  while( true ) {
    roaring::Roaring64Map::end(in_stack_fffffffffffff9d0);
    bVar2 = roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=
                      (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    if (!bVar2) break;
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
              (in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  }
  roaring::Roaring64Map::cardinality(in_stack_fffffffffffffa00);
  _assert_true((unsigned_long)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (char *)in_stack_fffffffffffff9d0,(int)((ulong)r >> 0x20));
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0);
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::cardinality(in_stack_fffffffffffffa00);
  _assert_int_equal((unsigned_long)in_stack_fffffffffffff9e0,
                    (unsigned_long)in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,
                    (int)((ulong)r >> 0x20));
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0,r);
  this = (Roaring64Map *)roaring::Roaring64Map::cardinality(in_stack_fffffffffffffa00);
  _assert_int_equal((unsigned_long)in_stack_fffffffffffff9e0,
                    (unsigned_long)in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,
                    (int)((ulong)r >> 0x20));
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1072c5);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1072d2);
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0);
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffff9d0);
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::add(in_stack_fffffffffffff9d0,(uint32_t)((ulong)r >> 0x20));
  roaring::Roaring64Map::cardinality(this);
  _assert_int_equal((unsigned_long)in_stack_fffffffffffff9e0,
                    (unsigned_long)in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,
                    (int)((ulong)r >> 0x20));
  b_00 = local_4c8;
  roaring::Roaring64Map::operator=(in_stack_fffffffffffff9d0,r);
  iVar5 = (int)((ulong)r >> 0x20);
  a_00 = roaring::Roaring64Map::cardinality(this);
  _assert_int_equal(a_00,(unsigned_long)b_00,(char *)in_stack_fffffffffffff9d0,iVar5);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073b0);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073bd);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073ca);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073d7);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073e4);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073f1);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1073fe);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10740b);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x107418);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x107425);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x107432);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10743f);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10744c);
  return;
}

Assistant:

void test_example_cpp_64(bool copy_on_write) {
    // create a new empty bitmap
    Roaring64Map r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint64_t i = 100; i < 1000; i++) {
        r1.add(i);
    }
    for (uint64_t i = 14000000000000000100ull; i < 14000000000000001000ull;
         i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains((uint64_t)14000000000000000500ull));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint64_t size = r1.getSizeInBytes();
    r1.runOptimize();
    uint64_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring64Map r2 =
        Roaring64Map::bitmapOf(5, 1ull, 2ull, 234294967296ull, 195839473298ull,
                               14000000000000000100ull);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring64Map r2i = Roaring64Map::bitmapOfList(
        {1, 2, 234294967296, 195839473298, 14000000000000000100ull});
    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring64Map r2id = {1, 2, 234294967296, 195839473298,
                         14000000000000000100ull};
    assert_true(r2id == r2);

    // test select
    uint64_t element;
    r2.select(4, &element);
    assert_true(element == 14000000000000000100ull);

    assert_true(r2.minimum() == 1ull);

    assert_true(r2.maximum() == 14000000000000000100ull);

    assert_true(r2.rank(234294967296ull) == 4ull);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring64Map r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint64_t *arr1 = new uint64_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint64Array(arr1);
    Roaring64Map r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring64Map z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring64Map r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring64Map *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring64Map bigunion = Roaring64Map::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring64Map i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring64Map t = Roaring64Map::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);
    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint64_t counter = 0;
    r1.iterate(roaring_iterator_sumall64, &counter);
    /**
     * void roaring_iterator_sumall64(uint64_t value, void *param) {
     *        *(uint64_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring64Map::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    {
        Roaring64Map b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        Roaring64Map a(std::move(b));
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is now unspecified.
    }

    {
        Roaring64Map a, b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        a = std::move(b);
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is unspecified
    }
}